

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall spv::Instruction::~Instruction(Instruction *this)

{
  this->_vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->idOperand).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

virtual ~Instruction() {}